

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfSetLin(int64_t MshIdx,int KwdCod,...)

{
  double dVar1;
  char cVar2;
  bool bVar3;
  char in_AL;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  uint *puVar7;
  undefined8 *puVar8;
  long in_RCX;
  undefined4 *puVar9;
  double *pdVar10;
  uint *in_RDX;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  uint *in_R8;
  uint *puVar15;
  undefined8 in_R9;
  undefined4 *puVar16;
  long lVar17;
  undefined4 uVar18;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list VarArg;
  double local_e8 [2];
  uint *local_d8;
  long local_d0;
  uint *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (KwdCod < 0) {
    KwdCod = -KwdCod;
    puVar16 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar18 = 5;
  }
  else {
    puVar16 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar18 = *puVar16;
  }
  if (KwdCod - 0xf1U < 0xffffff10) {
    return 0;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar4 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
  if (iVar4 != 0) {
    return 0;
  }
  iVar4 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
  puVar15 = local_c8;
  lVar14 = local_d0;
  puVar7 = local_d8;
  if (iVar4 != 0) {
    return 0;
  }
  VarArg[0].overflow_arg_area = &stack0x00000008;
  VarArg[0].gp_offset = 0x10;
  VarArg[0].fp_offset = 0x30;
  switch(uVar18) {
  case 1:
  case 2:
  case 4:
    if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      for (lVar14 = 0; lVar14 < (int)puVar16[3]; lVar14 = lVar14 + 1) {
        cVar2 = *(char *)((long)puVar16 + lVar14 + 0xfd8);
        if (cVar2 == 'c') {
          uVar5 = VarArg[0]._0_8_ & 0xffffffff;
          if (uVar5 < 0x29) {
            VarArg[0].gp_offset = VarArg[0].gp_offset + 8;
            puVar8 = (undefined8 *)((long)local_e8 + uVar5);
          }
          else {
            puVar8 = (undefined8 *)VarArg[0].overflow_arg_area;
            VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
          }
          pcVar12 = (char *)*puVar8;
          sVar6 = strlen(pcVar12);
          if (0x3f < sVar6) {
            pcVar12[0x40] = '\0';
          }
          fputs(pcVar12,*(FILE **)(MshIdx + 0x300410));
        }
        else if (cVar2 == 'i') {
          uVar5 = VarArg[0]._0_8_ & 0xffffffff;
          if (*(int *)(MshIdx + 4) < 4) {
            if (VarArg[0].gp_offset < 0x29) {
              VarArg[0].gp_offset = VarArg[0].gp_offset + 8;
              puVar7 = (uint *)((long)local_e8 + uVar5);
            }
            else {
              puVar7 = (uint *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",(ulong)*puVar7);
          }
          else {
            if (VarArg[0].gp_offset < 0x29) {
              VarArg[0].gp_offset = VarArg[0].gp_offset + 8;
              puVar8 = (undefined8 *)((long)local_e8 + uVar5);
            }
            else {
              puVar8 = (undefined8 *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            fprintf(*(FILE **)(MshIdx + 0x300410),"%ld ",*puVar8);
          }
        }
        else if (cVar2 == 'r') {
          uVar5 = (ulong)VarArg[0].fp_offset;
          if (*(int *)(MshIdx + 0x18) == 0x20) {
            if (VarArg[0].fp_offset < 0xa1) {
              VarArg[0].fp_offset = VarArg[0].fp_offset + 0x10;
              puVar8 = (undefined8 *)((long)local_e8 + uVar5);
            }
            else {
              puVar8 = (undefined8 *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            uVar18 = (undefined4)*puVar8;
            pcVar12 = "%.9g ";
          }
          else {
            if (VarArg[0].fp_offset < 0xa1) {
              VarArg[0].fp_offset = VarArg[0].fp_offset + 0x10;
              puVar8 = (undefined8 *)((long)local_e8 + uVar5);
            }
            else {
              puVar8 = (undefined8 *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            uVar18 = (undefined4)*puVar8;
            pcVar12 = "%.17g ";
          }
          fprintf(*(FILE **)(MshIdx + 0x300410),pcVar12,uVar18);
        }
      }
      goto switchD_00108846_default;
    }
    iVar4 = 0;
    for (lVar14 = 0; lVar14 < (int)puVar16[3]; lVar14 = lVar14 + 1) {
      cVar2 = *(char *)((long)puVar16 + lVar14 + 0xfd8);
      lVar17 = (long)iVar4;
      if (cVar2 == 'c') {
        memset((void *)(*(long *)(MshIdx + 0x300428) + lVar17),0,0x100);
        uVar5 = VarArg[0]._0_8_ & 0xffffffff;
        if (uVar5 < 0x29) {
          VarArg[0].gp_offset = VarArg[0].gp_offset + 8;
          puVar8 = (undefined8 *)((long)local_e8 + uVar5);
        }
        else {
          puVar8 = (undefined8 *)VarArg[0].overflow_arg_area;
          VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
        }
        strncpy((char *)(*(long *)(MshIdx + 0x300428) + lVar17),(char *)*puVar8,0x100);
        iVar4 = iVar4 + 0x40;
      }
      else if (cVar2 == 'i') {
        uVar5 = VarArg[0]._0_8_ & 0xffffffff;
        if (*(int *)(MshIdx + 4) < 4) {
          if (VarArg[0].gp_offset < 0x29) {
            VarArg[0].gp_offset = VarArg[0].gp_offset + 8;
            puVar9 = (undefined4 *)((long)local_e8 + uVar5);
          }
          else {
            puVar9 = (undefined4 *)VarArg[0].overflow_arg_area;
            VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
          }
          *(undefined4 *)(*(long *)(MshIdx + 0x300428) + lVar17) = *puVar9;
          goto LAB_001089b6;
        }
        if (VarArg[0].gp_offset < 0x29) {
          VarArg[0].gp_offset = VarArg[0].gp_offset + 8;
          puVar8 = (undefined8 *)((long)local_e8 + uVar5);
        }
        else {
          puVar8 = (undefined8 *)VarArg[0].overflow_arg_area;
          VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
        }
        *(undefined8 *)(*(long *)(MshIdx + 0x300428) + lVar17) = *puVar8;
LAB_001089d6:
        iVar4 = iVar4 + 8;
      }
      else if (cVar2 == 'r') {
        uVar5 = (ulong)VarArg[0].fp_offset;
        if (*(int *)(MshIdx + 0x18) != 0x20) {
          if (VarArg[0].fp_offset < 0xa1) {
            VarArg[0].fp_offset = VarArg[0].fp_offset + 0x10;
            puVar8 = (undefined8 *)((long)local_e8 + uVar5);
          }
          else {
            puVar8 = (undefined8 *)VarArg[0].overflow_arg_area;
            VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
          }
          *(undefined8 *)(*(long *)(MshIdx + 0x300428) + lVar17) = *puVar8;
          goto LAB_001089d6;
        }
        if (VarArg[0].fp_offset < 0xa1) {
          VarArg[0].fp_offset = VarArg[0].fp_offset + 0x10;
          pdVar10 = (double *)((long)local_e8 + uVar5);
        }
        else {
          pdVar10 = (double *)VarArg[0].overflow_arg_area;
          VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
        }
        *(float *)(*(long *)(MshIdx + 0x300428) + lVar17) = (float)*pdVar10;
LAB_001089b6:
        iVar4 = iVar4 + 4;
      }
    }
    break;
  case 3:
    if (*(int *)(MshIdx + 0x18) == 0x20) {
      if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
        for (lVar14 = 0; lVar14 < (int)puVar16[3]; lVar14 = lVar14 + 1) {
          fprintf(*(FILE **)(MshIdx + 0x300410),"%.9g ",SUB84((double)(float)puVar7[lVar14],0));
        }
        goto switchD_00108846_default;
      }
    }
    else if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      for (lVar14 = 0; lVar14 < (int)puVar16[3]; lVar14 = lVar14 + 1) {
        fprintf(*(FILE **)(MshIdx + 0x300410),"%.17g ",(int)*(undefined8 *)(puVar7 + lVar14 * 2));
      }
      goto switchD_00108846_default;
    }
    iVar4 = puVar16[4];
    goto LAB_00108ce9;
  case 5:
    if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      for (lVar17 = 0; lVar17 < (int)puVar16[3]; lVar17 = lVar17 + 1) {
        cVar2 = *(char *)((long)puVar16 + lVar17 + 0xfd8);
        if (cVar2 == 'i') {
          bVar3 = (long)(int)puVar16[3] + -1 <= lVar17;
          if (*(int *)(MshIdx + 4) < 4) {
            if (bVar3 && ""[(uint)KwdCod] != '\0') {
              uVar13 = *puVar15;
            }
            else {
              uVar13 = puVar7[lVar17];
            }
            fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",(ulong)uVar13);
          }
          else {
            if (bVar3 && ""[(uint)KwdCod] != '\0') {
              uVar13 = *puVar15;
            }
            else {
              uVar13 = puVar7[lVar17];
            }
            fprintf(*(FILE **)(MshIdx + 0x300410),"%ld ",(long)(int)uVar13);
          }
        }
        else if (cVar2 == 'r') {
          dVar1 = *(double *)(lVar14 + lVar17 * 8);
          uVar18 = SUB84(dVar1,0);
          if (*(int *)(MshIdx + 0x18) == 0x20) {
            uVar18 = SUB84((double)(float)dVar1,0);
            pcVar12 = "%.9g ";
          }
          else {
            pcVar12 = "%.17g ";
          }
          fprintf(*(FILE **)(MshIdx + 0x300410),pcVar12,uVar18);
        }
      }
      goto switchD_00108846_default;
    }
    uVar11 = 0;
    uVar5 = uVar11;
    for (; (long)uVar11 < (long)(int)puVar16[3]; uVar11 = uVar11 + 1) {
      cVar2 = *(char *)((long)puVar16 + uVar11 + 0xfd8);
      iVar4 = (int)uVar5;
      lVar14 = (long)iVar4;
      if (cVar2 == 'i') {
        puVar15 = local_c8;
        if ((long)uVar11 < (long)(int)puVar16[3] + -1) {
          puVar15 = puVar7;
        }
        if (""[(uint)KwdCod] == '\0') {
          puVar15 = puVar7;
        }
        if (*(int *)(MshIdx + 4) < 4) {
          *(uint *)(*(long *)(MshIdx + 0x300428) + lVar14) = *puVar15;
          goto LAB_00108cb4;
        }
        *(long *)(*(long *)(MshIdx + 0x300428) + lVar14) = (long)(int)*puVar15;
LAB_00108cc8:
        uVar13 = iVar4 + 8;
LAB_00108ccb:
        uVar5 = (ulong)uVar13;
      }
      else if (cVar2 == 'r') {
        dVar1 = *(double *)(local_d0 + uVar11 * 8);
        if (*(int *)(MshIdx + 0x18) != 0x20) {
          *(double *)(*(long *)(MshIdx + 0x300428) + lVar14) = dVar1;
          goto LAB_00108cc8;
        }
        *(float *)(*(long *)(MshIdx + 0x300428) + lVar14) = (float)dVar1;
LAB_00108cb4:
        uVar13 = iVar4 + 4;
        goto LAB_00108ccb;
      }
      puVar7 = puVar7 + 1;
    }
    break;
  default:
    goto switchD_00108846_default;
  }
  iVar4 = puVar16[4];
  puVar7 = *(uint **)(MshIdx + 0x300428);
LAB_00108ce9:
  RecBlk((GmfMshSct *)MshIdx,puVar7,iVar4);
switchD_00108846_default:
  if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
    fputc(10,*(FILE **)(MshIdx + 0x300410));
  }
  return 1;
}

Assistant:

int GmfSetLin(int64_t MshIdx, int KwdCod, ...)
{
   char        *str;
   int         i, pos, *IntBuf, err, typ, *IntTab, *RefPtr;
   int64_t     *LngBuf;
   float       *FltSolTab, *FltBuf;
   double      *DblSolTab, *DblBuf, *DblTab;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   // Special trick: if the kwd is negative the call come from Fortran
   if(KwdCod < 0)
   {
      // Set Fortran mode ON
      KwdCod = -KwdCod;
      kwd = &msh->KwdTab[ KwdCod ];
      typ = F77Kwd;
   }
   else
   {
      kwd = &msh->KwdTab[ KwdCod ];
      typ = kwd->typ;
   }

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);
 
   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Start decoding the arguments
   va_start(VarArg, KwdCod);

   switch(typ)
   {
      case InfKwd : case RegKwd : case CmtKwd :
      {
         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", va_arg(VarArg, double));
                  else
                     fprintf(msh->hdl, "%.17g ", va_arg(VarArg, double));
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     fprintf(msh->hdl, "%d ", va_arg(VarArg, int));
                  else
                  {
                     // [Bruno] %ld -> INT64_T_FMT
                     fprintf(msh->hdl, INT64_T_FMT " ", va_arg(VarArg, int64_t));
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  // Safety check: if the string is greater than 64 characters
                  // truncate it with an ending 0
                  str = va_arg(VarArg, char *);

                  if(strlen(str) >= FilStrSiz)
                     str[ FilStrSiz ] = 0;

                  fputs(str, msh->hdl);
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)va_arg(VarArg, double);
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = va_arg(VarArg, double);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];
                     *IntBuf = va_arg(VarArg, int);
                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];
                     *LngBuf = va_arg(VarArg, int64_t);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  memset(&msh->buf[ pos ], 0, FilStrSiz * WrdSiz);
                  strncpy(&msh->buf[ pos ], va_arg(VarArg, char *), FilStrSiz * WrdSiz);
                  pos += FilStrSiz;
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;

      case SolKwd :
      {
         if(msh->FltSiz == 32)
         {
            FltSolTab = va_arg(VarArg, float *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.9g ", (double)FltSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)FltSolTab, kwd->NmbWrd);
         }
         else
         {
            DblSolTab = va_arg(VarArg, double *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.17g ", DblSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)DblSolTab, kwd->NmbWrd);
         }
      }break;

      case F77Kwd :
      {
         IntTab = va_arg(VarArg, int *);
         DblTab = va_arg(VarArg, double *);
         RefPtr = va_arg(VarArg, int *);

         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", (float)DblTab[i]);
                  else
                     fprintf(msh->hdl, "%.17g ", DblTab[i]);
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, "%d ", IntTab[i]);
                     else
                        fprintf(msh->hdl, "%d ", *RefPtr);
                  else
                  {
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)IntTab[i]);
                     else
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)*RefPtr);
                  }
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)DblTab[i];
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = DblTab[i];
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *IntBuf = IntTab[i];
                     else
                        *IntBuf = *RefPtr;

                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *LngBuf = (int64_t)IntTab[i];
                     else
                        *LngBuf = (int64_t)*RefPtr;

                     pos += 8;
                  }
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;
   }

   va_end(VarArg);

   if(msh->typ & Asc)
      fprintf(msh->hdl, "\n");

   return(1);
}